

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

bool __thiscall wallet::SQLiteBatch::TxnAbort(SQLiteBatch *this)

{
  long lVar1;
  SQliteExecHandler *pSVar2;
  SQLiteDatabase *pSVar3;
  string sVar4;
  bool bVar5;
  int iVar6;
  unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_> *puVar7;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  Level in_stack_ffffffffffffffa8;
  allocator<char> local_51;
  undefined7 in_stack_ffffffffffffffb1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_database->m_db != (sqlite3 *)0x0) && (this->m_txn == true)) {
    sVar4 = (string)SQLiteDatabase::HasActiveTxn(this->m_database);
    inline_assertion_check<true,bool>
              ((bool *)&stack0xffffffffffffffb0,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
               ,0x2ab,"TxnAbort","m_database.HasActiveTxn()");
    puVar7 = inline_assertion_check<true,std::unique_ptr<wallet::SQliteExecHandler,std::default_delete<wallet::SQliteExecHandler>>&>
                       (&this->m_exec_handler,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                        ,0x2ac,"TxnAbort","m_exec_handler");
    pSVar2 = (puVar7->_M_t).
             super___uniq_ptr_impl<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::SQliteExecHandler_*,_std::default_delete<wallet::SQliteExecHandler>_>
             .super__Head_base<0UL,_wallet::SQliteExecHandler_*,_false>._M_head_impl;
    pSVar3 = this->m_database;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffb0,"ROLLBACK TRANSACTION",&local_51);
    iVar6 = (*pSVar2->_vptr_SQliteExecHandler[2])(pSVar2,pSVar3,(string *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    if (iVar6 == 0) {
      this->m_txn = false;
      CSemaphore::post(&this->m_database->m_write_semaphore);
      bVar5 = true;
      goto LAB_004a7b16;
    }
    logging_function._M_str = "TxnAbort";
    logging_function._M_len = 8;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x5a;
    ::LogPrintf_<>(logging_function,source_file,0x2ae,
                   I2P|VALIDATION|QT|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|RAND|CMPCTBLOCK|REINDEX|
                   ADDRMAN|ESTIMATEFEE|RPC|HTTP,in_stack_ffffffffffffffa8,
                   (char *)CONCAT71(in_stack_ffffffffffffffb1,sVar4));
  }
  bVar5 = false;
LAB_004a7b16:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::TxnAbort()
{
    if (!m_database.m_db || !m_txn) return false;
    Assert(m_database.HasActiveTxn());
    int res = Assert(m_exec_handler)->Exec(m_database, "ROLLBACK TRANSACTION");
    if (res != SQLITE_OK) {
        LogPrintf("SQLiteBatch: Failed to abort the transaction\n");
    } else {
        m_txn = false;
        m_database.m_write_semaphore.post();
    }
    return res == SQLITE_OK;
}